

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Music_Emu.cpp
# Opt level: O2

void __thiscall Music_Emu::unload(Music_Emu *this)

{
  this->voice_count_ = 0;
  clear_track_vars(this);
  Gme_File::unload(&this->super_Gme_File);
  return;
}

Assistant:

void Music_Emu::unload()
{
	voice_count_ = 0;
	clear_track_vars();
	Gme_File::unload();
}